

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int lyd_wd_add_subtree(lyd_node **root,lyd_node *last_parent,lyd_node *subroot,lys_node *schema,
                      int toplevel,int options,unres_data *unres)

{
  int iVar1;
  LYS_NODE LVar2;
  uint uVar3;
  ly_set *set;
  lys_node *plVar4;
  lyd_node **pplVar5;
  lys_node *plVar6;
  lys_node *node;
  lyd_node *plVar7;
  long lVar8;
  lyd_node *local_40;
  
  if (((char)options != '\0') && ((schema->flags & 2) != 0)) {
    return 0;
  }
  if ((toplevel != 0) &&
     ((schema->nodetype & (LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CONTAINER)) != LYS_UNKNOWN)) {
    set = (ly_set *)calloc(1,0x10);
    if (set != (ly_set *)0x0) {
      if ((*root != (lyd_node *)0x0) &&
         (iVar1 = lyd_get_node_siblings(*root,schema,set), iVar1 != 0)) {
        if (0 < (int)set->number) {
          lVar8 = 0;
          do {
            if ((schema->nodetype & LYS_LEAFLIST) == LYS_UNKNOWN) {
              if ((schema->nodetype != LYS_LEAF) &&
                 (iVar1 = lyd_wd_add_subtree(root,(lyd_node *)(set->set).s[lVar8],
                                             (lyd_node *)(set->set).s[lVar8],schema,0,options,unres)
                 , iVar1 != 0)) goto LAB_00163539;
            }
            else {
              lyd_wd_leaflist_cleanup(set);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < (int)set->number);
        }
LAB_001631d2:
        free((set->set).s);
        free(set);
        return 0;
      }
      iVar1 = lyd_wd_add_subtree(root,last_parent,(lyd_node *)0x0,schema,0,options,unres);
      if (iVar1 == 0) goto LAB_001631d2;
      goto LAB_00163539;
    }
    goto LAB_00163537;
  }
  if (subroot == (lyd_node *)0x0) {
    plVar4 = schema->parent;
    if (((plVar4 != (lys_node *)0x0) && (plVar4->nodetype == LYS_AUGMENT)) &&
       (plVar4 = lys_is_disabled(plVar4,0), plVar4 != (lys_node *)0x0)) {
      return 0;
    }
    plVar4 = lys_is_disabled(schema,0);
    if (plVar4 != (lys_node *)0x0) {
      return 0;
    }
  }
  LVar2 = schema->nodetype;
  set = (ly_set *)0x0;
  local_40 = last_parent;
  if (0x3f < (int)LVar2) {
    if ((int)LVar2 < 0x200) {
      if ((LVar2 != LYS_CASE) && (LVar2 != LYS_NOTIF)) goto switchD_001630e1_caseD_3;
    }
    else if ((LVar2 != LYS_INPUT) && ((LVar2 != LYS_OUTPUT && (LVar2 != LYS_USES))))
    goto switchD_001630e1_caseD_3;
    goto LAB_00163236;
  }
  set = (ly_set *)0x0;
  switch(LVar2) {
  case LYS_CONTAINER:
    if (subroot == (lyd_node *)0x0) {
      lVar8._0_2_ = schema[1].flags;
      lVar8._2_1_ = schema[1].ext_size;
      lVar8._3_1_ = schema[1].iffeature_size;
      lVar8._4_1_ = schema[1].padding[0];
      lVar8._5_1_ = schema[1].padding[1];
      lVar8._6_1_ = schema[1].padding[2];
      lVar8._7_1_ = schema[1].padding[3];
      if (lVar8 != 0) goto LAB_0016341b;
      subroot = _lyd_new(last_parent,schema,1);
      if (last_parent == (lyd_node *)0x0) {
        if (*root == (lyd_node *)0x0) {
          *root = subroot;
        }
        else {
          lyd_insert_sibling(root,subroot);
        }
      }
      local_40 = subroot;
      if (((options & 0x208eU) == 0) &&
         (((((subroot->field_0x9 & 8) != 0 &&
            (iVar1 = unres_data_add(unres,subroot,UNRES_WHEN), iVar1 == -1)) ||
           ((uVar3 = resolve_applies_must(subroot), (uVar3 & 1) != 0 &&
            (iVar1 = unres_data_add(unres,subroot,UNRES_MUST), iVar1 == -1)))) ||
          (((uVar3 & 2) != 0 &&
           (iVar1 = unres_data_add(unres,subroot,UNRES_MUST_INOUT), iVar1 == -1))))))
      goto LAB_00163537;
    }
    break;
  case LYS_CHOICE:
    if (toplevel == 0) {
      if (subroot != (lyd_node *)0x0) goto LAB_00163396;
    }
    else if (*root != (lyd_node *)0x0) {
LAB_00163396:
      pplVar5 = &subroot->child;
      if (toplevel != 0) {
        pplVar5 = root;
      }
      for (plVar7 = *pplVar5; plVar7 != (lyd_node *)0x0; plVar7 = plVar7->next) {
        plVar6 = lys_parent(plVar7->schema);
        plVar4 = plVar7->schema;
        while (node = plVar6, node != (lys_node *)0x0) {
          if ((node == schema) || ((node->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) == LYS_UNKNOWN)
             ) goto LAB_001633e3;
          plVar6 = lys_parent(node);
          plVar4 = node;
        }
        node = (lys_node *)0x0;
LAB_001633e3:
        if (node == schema) {
          if ((schema == (lys_node *)0x0) || (plVar4 == (lys_node *)0x0)) {
            __assert_fail("siter && siter_prev",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                          ,0x1810,
                          "int lyd_wd_add_subtree(struct lyd_node **, struct lyd_node *, struct lyd_node *, struct lys_node *, int, int, struct unres_data *)"
                         );
          }
          goto LAB_00163448;
        }
      }
    }
    plVar4 = (lys_node *)schema[1].dsc;
    if (plVar4 == (lys_node *)0x0) {
LAB_0016341b:
      set = (ly_set *)0x0;
      goto switchD_001630e1_caseD_3;
    }
LAB_00163448:
    iVar1 = lyd_wd_add_subtree(root,last_parent,subroot,plVar4,toplevel,options,unres);
    set = (ly_set *)0x0;
    goto LAB_00163456;
  case LYS_CHOICE|LYS_CONTAINER:
  case LYS_LEAF|LYS_CONTAINER:
  case LYS_LEAF|LYS_CHOICE:
  case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
    goto switchD_001630e1_caseD_3;
  case LYS_LEAF:
  case LYS_LEAFLIST:
    if (subroot == (lyd_node *)0x0) {
      set = (ly_set *)0x0;
    }
    else {
      set = (ly_set *)calloc(1,0x10);
      if (set == (ly_set *)0x0) goto LAB_00163537;
      lyd_get_node_siblings(subroot->child,schema,set);
      if (set->number != 0) goto switchD_001630e1_caseD_3;
      LVar2 = schema->nodetype;
    }
    uVar3 = (uint)((options & 0x208eU) == 0);
    if (LVar2 == LYS_LEAF) {
      iVar1 = lyd_wd_add_leaf(root,last_parent,(lys_node_leaf *)schema,unres,uVar3);
      if (iVar1 != 0) {
        return 1;
      }
      goto switchD_001630e1_caseD_3;
    }
    iVar1 = lyd_wd_add_leaflist(root,last_parent,(lys_node_leaflist *)schema,unres,uVar3);
LAB_00163456:
    if (iVar1 != 0) goto LAB_00163539;
    goto switchD_001630e1_caseD_3;
  default:
    if (LVar2 != LYS_LIST) goto switchD_001630e1_caseD_3;
    if (subroot == (lyd_node *)0x0) goto LAB_0016341b;
  }
LAB_00163236:
  set = (ly_set *)calloc(1,0x10);
  if (set == (ly_set *)0x0) {
LAB_00163537:
    set = (ly_set *)0x0;
LAB_00163539:
    ly_set_free(set);
    return 1;
  }
  for (plVar4 = schema->child; plVar4 != (lys_node *)0x0; plVar4 = plVar4->next) {
    plVar7 = subroot;
    if ((plVar4->nodetype & (LYS_USES|LYS_CHOICE)) == LYS_UNKNOWN) {
      if ((plVar4->nodetype & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CONTAINER)) !=
          LYS_UNKNOWN) {
        if ((subroot == (lyd_node *)0x0) ||
           (iVar1 = lyd_get_node_siblings(subroot->child,plVar4,set), iVar1 == 0)) {
          plVar7 = (lyd_node *)0x0;
          goto LAB_00163284;
        }
        if ((plVar4->nodetype & LYS_LEAFLIST) == LYS_UNKNOWN) {
          if ((plVar4->nodetype != LYS_LEAF) && (0 < (int)set->number)) {
            lVar8 = 0;
            do {
              iVar1 = lyd_wd_add_subtree(root,(lyd_node *)(set->set).s[lVar8],
                                         (lyd_node *)(set->set).s[lVar8],plVar4,toplevel,options,
                                         unres);
              if (iVar1 != 0) goto LAB_00163539;
              lVar8 = lVar8 + 1;
            } while (lVar8 < (int)set->number);
          }
        }
        else {
          lyd_wd_leaflist_cleanup(set);
        }
        set->number = 0;
      }
    }
    else {
LAB_00163284:
      iVar1 = lyd_wd_add_subtree(root,local_40,plVar7,plVar4,toplevel,options,unres);
      if (iVar1 != 0) goto LAB_00163539;
    }
  }
switchD_001630e1_caseD_3:
  ly_set_free(set);
  return 0;
}

Assistant:

static int
lyd_wd_add_subtree(struct lyd_node **root, struct lyd_node *last_parent, struct lyd_node *subroot,
                   struct lys_node *schema, int toplevel, int options, struct unres_data *unres)
{
    struct ly_set *present = NULL;
    struct lys_node *siter, *siter_prev;
    struct lyd_node *iter;
    int i, check_when_must;

    assert(root);

    if ((options & LYD_OPT_TYPEMASK) && (schema->flags & LYS_CONFIG_R)) {
        /* non LYD_OPT_DATA tree, status data are not expected here */
        return EXIT_SUCCESS;
    }

    if (options & (LYD_OPT_TRUSTED | LYD_OPT_NOTIF_FILTER | LYD_OPT_EDIT | LYD_OPT_GET | LYD_OPT_GETCONFIG)) {
        check_when_must = 0;
    } else {
        check_when_must = 1;
    }

    if (toplevel && (schema->nodetype & (LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_CONTAINER))) {
        /* search for the schema node instance */
        present = ly_set_new();
        if (!present) {
            goto error;
        }
        if ((*root) && lyd_get_node_siblings(*root, schema, present)) {
            /* there are some instances */
            for (i = 0; i < (signed)present->number; i++) {
                if (schema->nodetype & LYS_LEAFLIST) {
                    lyd_wd_leaflist_cleanup(present);
                } else if (schema->nodetype != LYS_LEAF) {
                    if (lyd_wd_add_subtree(root, present->set.d[i], present->set.d[i], schema, 0, options, unres)) {
                        goto error;
                    }
                } /* else LYS_LEAF - nothing to do */
            }
        } else {
            /* no instance */
            if (lyd_wd_add_subtree(root, last_parent, NULL, schema, 0, options, unres)) {
                goto error;
            }
        }

        ly_set_free(present);
        return EXIT_SUCCESS;
    }

    /* skip disabled parts of schema */
    if (!subroot) {
        if (schema->parent && schema->parent->nodetype == LYS_AUGMENT) {
            if (lys_is_disabled(schema->parent, 0)) {
                /* ignore disabled augment */
                return EXIT_SUCCESS;
            }
        }
        if (lys_is_disabled(schema, 0)) {
            /* ignore disabled data */
            return EXIT_SUCCESS;
        }
    }

    switch (schema->nodetype) {
    case LYS_LIST:
        if (!subroot) {
            /* stop recursion */
            break;
        }
        /* no break */
    case LYS_CONTAINER:
        if (!subroot) {
            /* container does not exists, continue only in case of non presence container */
            if (((struct lys_node_container *)schema)->presence) {
                /* stop recursion */
                break;
            }
            /* always create empty NP container even if there is no default node,
             * because accroding to RFC, the empty NP container is always part of
             * accessible tree (e.g. for evaluating when and must conditions) */
            subroot = _lyd_new(last_parent, schema, 1);
            if (!last_parent) {
                if (*root) {
                    lyd_insert_sibling(root, subroot);
                } else {
                    *root = subroot;
                }
            }
            last_parent = subroot;

            /* remember the created container in unres */
            if (check_when_must) {
                if ((subroot->when_status & LYD_WHEN) && unres_data_add(unres, subroot, UNRES_WHEN) == -1) {
                    goto error;
                }
                i = resolve_applies_must(subroot);
                if ((i & 0x1) && (unres_data_add(unres, subroot, UNRES_MUST) == -1)) {
                    goto error;
                }
                if ((i & 0x2) && (unres_data_add(unres, subroot, UNRES_MUST_INOUT) == -1)) {
                    goto error;
                }
            }
        }
        /* no break */
    case LYS_CASE:
    case LYS_USES:
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:

        /* recursion */
        present = ly_set_new();
        if (!present) {
            goto error;
        }
        LY_TREE_FOR(schema->child, siter) {
            if (siter->nodetype & (LYS_CHOICE | LYS_USES)) {
                /* go into without searching for data instance */
                if (lyd_wd_add_subtree(root, last_parent, subroot, siter, toplevel, options, unres)) {
                    goto error;
                }
            } else if (siter->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA)) {
                /* search for the schema node instance */
                if (subroot && lyd_get_node_siblings(subroot->child, siter, present)) {
                    /* there are some instances in the data root */
                    if (siter->nodetype & LYS_LEAFLIST) {
                        /* already have some leaflists, check that they are all
                         * default, if not, remove the default leaflists */
                        lyd_wd_leaflist_cleanup(present);
                    } else if (siter->nodetype != LYS_LEAF) {
                        /* recursion */
                        for (i = 0; i < (signed)present->number; i++) {
                            if (lyd_wd_add_subtree(root, present->set.d[i], present->set.d[i], siter, toplevel, options,
                                                   unres)) {
                                goto error;
                            }
                        }
                    } /* else LYS_LEAF - nothing to do */
                    ly_set_clean(present);
                } else {
                    /* no instance */
                    if (lyd_wd_add_subtree(root, last_parent, NULL, siter, toplevel, options, unres)) {
                        goto error;
                    }
                }
            }
        }
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
        if (subroot) {
            /* default shortcase of a choice */
            present = ly_set_new();
            if (!present) {
                goto error;
            }
            lyd_get_node_siblings(subroot->child, schema, present);
            if (present->number) {
                /* the shortcase leaf(-list) exists, stop the processing */
                break;
            }
        }
        if (schema->nodetype == LYS_LEAF) {
            if (lyd_wd_add_leaf(root, last_parent, (struct lys_node_leaf*)schema, unres, check_when_must)) {
                return EXIT_FAILURE;
            }
        } else { /* LYS_LEAFLIST */
            if (lyd_wd_add_leaflist(root, last_parent, (struct lys_node_leaflist*)schema, unres, check_when_must)) {
                goto error;
            }
        }
        break;
    case LYS_CHOICE:
        /* get existing node in the data root from the choice */
        iter = NULL;
        if ((toplevel && (*root)) || (!toplevel && subroot)) {
            LY_TREE_FOR(toplevel ? (*root) : subroot->child, iter) {
                for (siter = lys_parent(iter->schema), siter_prev = iter->schema;
                        siter && (siter->nodetype & (LYS_CASE | LYS_USES | LYS_CHOICE));
                        siter_prev = siter, siter = lys_parent(siter)) {
                    if (siter == schema) {
                        /* we have the choice instance */
                        break;
                    }
                }
                if (siter == schema) {
                    /* we have the choice instance;
                     * the condition must be the same as in the loop because of
                     * choice's sibling nodes that break the loop, so siter is not NULL,
                     * but it is not the same as schema */
                    break;
                }
            }
        }
        if (!iter) {
            if (((struct lys_node_choice *)schema)->dflt) {
                /* there is a default case */
                if (lyd_wd_add_subtree(root, last_parent, subroot, ((struct lys_node_choice *)schema)->dflt,
                                       toplevel, options, unres)) {
                    goto error;
                }
            }
        } else {
            /* one of the choice's cases is instantiated, continue into this case */
            /* since iter != NULL, siter must be also != NULL and we also know siter_prev
             * which points to the child of schema leading towards the instantiated data */
            assert(siter && siter_prev);
            if (lyd_wd_add_subtree(root, last_parent, subroot, siter_prev, toplevel, options, unres)) {
                goto error;
            }
        }
        break;
    default:
        /* LYS_ANYXML, LYS_ANYDATA, LYS_USES, LYS_GROUPING - do nothing */
        break;
    }

    ly_set_free(present);
    return EXIT_SUCCESS;

error:
    ly_set_free(present);
    return EXIT_FAILURE;
}